

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::SamplerTest::SamplerTest
          (SamplerTest *this,TestContext *testContext,char *name,char *description,
          VkImageViewType imageViewType,VkFormat imageFormat,int imageSize,float samplerLod)

{
  allocator<char> local_6e;
  allocator<char> local_6d;
  float local_6c;
  string local_68;
  string local_48;
  
  local_6c = samplerLod;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_6d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,description,&local_6e);
  TestCase::TestCase(&this->super_TestCase,testContext,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00bfce80;
  this->m_imageViewType = imageViewType;
  this->m_imageFormat = imageFormat;
  this->m_imageSize = imageSize;
  this->m_samplerLod = local_6c;
  return;
}

Assistant:

SamplerTest::SamplerTest (tcu::TestContext&	testContext,
						  const char*		name,
						  const char*		description,
						  VkImageViewType	imageViewType,
						  VkFormat			imageFormat,
						  int				imageSize,
						  float				samplerLod)
	: vkt::TestCase		(testContext, name, description)
	, m_imageViewType	(imageViewType)
	, m_imageFormat		(imageFormat)
	, m_imageSize		(imageSize)
	, m_samplerLod		(samplerLod)
{
}